

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_NewFrame(void)

{
  int iVar1;
  ImGuiMouseCursor IVar2;
  ImGuiIO *pIVar3;
  ImGuiIO *pIVar4;
  ImGuiContext *pIVar5;
  GLFWcursor *cursorHandle;
  undefined8 *puVar6;
  float fVar7;
  ImVec2 IVar8;
  double dVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double mouse_x;
  int display_h;
  int display_w;
  int h;
  int w;
  GLFWgamepadstate local_60;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  double local_28;
  
  pIVar3 = ImGui::GetIO();
  ImGui::GetCurrentContext();
  pIVar4 = ImGui::GetIO();
  puVar6 = (undefined8 *)pIVar4->BackendPlatformUserData;
  glfwGetWindowSize((GLFWwindow *)*puVar6,&local_2c,&local_30);
  glfwGetFramebufferSize((GLFWwindow *)*puVar6,&local_34,&local_38);
  IVar8.x = (float)local_2c;
  IVar8.y = (float)local_30;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = IVar8.x;
  auVar12._4_4_ = IVar8.y;
  pIVar3->DisplaySize = IVar8;
  if (0 < local_30 && 0 < local_2c) {
    auVar11._0_4_ = (float)local_34;
    auVar11._4_4_ = (float)local_38;
    auVar11._8_8_ = 0;
    auVar12 = divps(auVar11,auVar12);
    pIVar3->DisplayFramebufferScale = auVar12._0_8_;
  }
  dVar9 = glfwGetTime();
  if (0.0 < (double)puVar6[2]) {
    fVar10 = (float)(dVar9 - (double)puVar6[2]);
  }
  else {
    fVar10 = 0.016666668;
  }
  pIVar3->DeltaTime = fVar10;
  puVar6[2] = dVar9;
  pIVar5 = ImGui::GetCurrentContext();
  if (pIVar5 == (ImGuiContext *)0x0) {
    puVar6 = (undefined8 *)0x0;
  }
  else {
    pIVar3 = ImGui::GetIO();
    puVar6 = (undefined8 *)pIVar3->BackendPlatformUserData;
  }
  pIVar3 = ImGui::GetIO();
  iVar1 = glfwGetInputMode((GLFWwindow *)*puVar6,0x33001);
  if (iVar1 == 0x34003) {
    ImGuiIO::AddMousePosEvent(pIVar3,-3.4028235e+38,-3.4028235e+38);
  }
  else {
    iVar1 = glfwGetWindowAttrib((GLFWwindow *)*puVar6,0x20001);
    if (iVar1 != 0) {
      if (pIVar3->WantSetMousePos == true) {
        glfwSetCursorPos((GLFWwindow *)*puVar6,(double)(pIVar3->MousePos).x,
                         (double)(pIVar3->MousePos).y);
      }
      if (puVar6[3] == 0) {
        glfwGetCursorPos((GLFWwindow *)*puVar6,(double *)&local_60,&local_28);
        ImGuiIO::AddMousePosEvent
                  (pIVar3,(float)(double)CONCAT17(local_60.buttons[7],
                                                  CONCAT16(local_60.buttons[6],
                                                           CONCAT15(local_60.buttons[5],
                                                                    CONCAT14(local_60.buttons[4],
                                                                             CONCAT13(local_60.
                                                  buttons[3],
                                                  CONCAT12(local_60.buttons[2],
                                                           CONCAT11(local_60.buttons[1],
                                                                    local_60.buttons[0]))))))),
                   (float)local_28);
        puVar6[0xd] = CONCAT44((float)local_28,
                               (float)(double)CONCAT17(local_60.buttons[7],
                                                       CONCAT16(local_60.buttons[6],
                                                                CONCAT15(local_60.buttons[5],
                                                                         CONCAT14(local_60.buttons
                                                                                  [4],CONCAT13(
                                                  local_60.buttons[3],
                                                  CONCAT12(local_60.buttons[2],
                                                           CONCAT11(local_60.buttons[1],
                                                                    local_60.buttons[0]))))))));
      }
    }
  }
  pIVar3 = ImGui::GetIO();
  pIVar5 = ImGui::GetCurrentContext();
  if (pIVar5 == (ImGuiContext *)0x0) {
    puVar6 = (undefined8 *)0x0;
  }
  else {
    pIVar4 = ImGui::GetIO();
    puVar6 = (undefined8 *)pIVar4->BackendPlatformUserData;
  }
  if ((pIVar3->ConfigFlags & 0x20) == 0) {
    iVar1 = glfwGetInputMode((GLFWwindow *)*puVar6,0x33001);
    if (iVar1 != 0x34003) {
      IVar2 = ImGui::GetMouseCursor();
      iVar1 = 0x34002;
      if ((IVar2 != -1) && (pIVar3->MouseDrawCursor == false)) {
        cursorHandle = (GLFWcursor *)puVar6[(long)IVar2 + 4];
        if (cursorHandle == (GLFWcursor *)0x0) {
          cursorHandle = (GLFWcursor *)puVar6[4];
        }
        glfwSetCursor((GLFWwindow *)*puVar6,cursorHandle);
        iVar1 = 0x34001;
      }
      glfwSetInputMode((GLFWwindow *)*puVar6,0x33001,iVar1);
    }
  }
  pIVar3 = ImGui::GetIO();
  if ((pIVar3->ConfigFlags & 2) != 0) {
    *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags & 0xfe;
    iVar1 = glfwGetGamepadState(0,&local_60);
    if (iVar1 != 0) {
      *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags | 1;
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadStart,local_60.buttons[7] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadBack,local_60.buttons[6] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceLeft,local_60.buttons[2] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceRight,local_60.buttons[1] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceUp,local_60.buttons[3] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceDown,local_60.buttons[0] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadLeft,local_60.buttons[0xe] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadRight,local_60.buttons[0xc] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadUp,local_60.buttons[0xb] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadDown,local_60.buttons[0xd] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadL1,local_60.buttons[4] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadR1,local_60.buttons[5] != '\0');
      fVar7 = (local_60.axes[4] + 0.75) / 1.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadL2,0.1 < fVar7,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10)
                );
      fVar7 = (local_60.axes[5] + 0.75) / 1.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadR2,0.1 < fVar7,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10)
                );
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadL3,local_60.buttons[9] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadR3,local_60.buttons[10] != '\0');
      fVar7 = (local_60.axes[0] + 0.25) / -0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickLeft,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[0] + -0.25) / 0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickRight,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[1] + 0.25) / -0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickUp,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[1] + -0.25) / 0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickDown,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[2] + 0.25) / -0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickLeft,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[2] + -0.25) / 0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickRight,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[3] + 0.25) / -0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickUp,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
      fVar7 = (local_60.axes[3] + -0.25) / 0.75;
      fVar10 = 1.0;
      if (fVar7 <= 1.0) {
        fVar10 = fVar7;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickDown,0.1 < fVar7,
                 (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10));
    }
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd != nullptr && "Did you call ImGui_ImplGlfw_InitForXXX()?");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(bd->Window, &w, &h);
    glfwGetFramebufferSize(bd->Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / (float)w, (float)display_h / (float)h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = bd->Time > 0.0 ? (float)(current_time - bd->Time) : (float)(1.0f / 60.0f);
    bd->Time = current_time;

    ImGui_ImplGlfw_UpdateMouseData();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}